

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall CLI::Validator::Validator(Validator *this)

{
  anon_class_1_0_00000001 local_12;
  anon_class_1_0_00000001 local_11;
  Validator *local_10;
  Validator *this_local;
  
  local_10 = this;
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::desc_function_::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)this,&local_11);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::Validator::func_::_lambda(std::__cxx11::string&)_1_,void>
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&this->func_,&local_12);
  ::std::__cxx11::string::string((string *)&this->name_);
  this->application_index_ = -1;
  this->active_ = true;
  this->non_modifying_ = false;
  return;
}

Assistant:

Validator() = default;